

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_vdpu382.c
# Opt level: O0

void hal_vp9d_rcb_info_update(void *hal,Vdpu382Vp9dRegSet *hw_regs,void *data)

{
  RK_S32 RVar1;
  MppBuffer local_60;
  MppBuffer rcb_buf_1;
  MppBuffer rcb_buf;
  RK_U32 local_48;
  RK_U32 i;
  RK_S32 width;
  RK_S32 height;
  RK_U32 bit_depth;
  RK_U32 num_tiles;
  DXVA_PicParams_VP9 *pic_param;
  Vdpu382Vp9dCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  void *data_local;
  Vdpu382Vp9dRegSet *hw_regs_local;
  void *hal_local;
  
  pic_param = *(DXVA_PicParams_VP9 **)((long)hal + 0x40);
  height = (RK_S32)*(byte *)((long)data + 0xc3);
  width = *(byte *)((long)data + 0xc) + 8;
  _bit_depth = data;
  hw_ctx = (Vdpu382Vp9dCtx *)hal;
  p_hal = (HalVp9dCtx *)data;
  data_local = hw_regs;
  hw_regs_local = (Vdpu382Vp9dRegSet *)hal;
  i = vp9_ver_align(*(RK_U32 *)((long)data + 8));
  local_48 = vp9_ver_align(*(RK_U32 *)((long)_bit_depth + 4));
  if ((((*(int *)((pic_param->prob).partition[2][0] + 1) != height) ||
       (*(int *)((pic_param->prob).partition[2][1] + 2) != width)) ||
      (*(RK_U32 *)((pic_param->prob).mv_mode[3] + 1) != local_48)) ||
     (*(RK_U32 *)((pic_param->prob).mv_mode[4] + 2) != i)) {
    RVar1 = vdpu382_get_rcb_buf_size((Vdpu382RcbInfo *)((pic_param->prob).intra + 1),local_48,i);
    *(RK_S32 *)((pic_param->prob).mv_mode + 6) = RVar1;
    vp9d_refine_rcb_size
              ((Vdpu382RcbInfo *)((pic_param->prob).intra + 1),(Vdpu382Vp9dRegSet *)data_local,
               local_48,i,_bit_depth);
    if (*(int *)&hw_ctx->g_buf[0].rcb_buf == 0) {
      local_60 = *(MppBuffer *)((pic_param->prob).partition[1][1] + 2);
      if (local_60 != (MppBuffer)0x0) {
        mpp_buffer_put_with_caller(local_60,"hal_vp9d_rcb_info_update");
        local_60 = (MppBuffer)0x0;
      }
      mpp_buffer_get_with_tag
                (hw_ctx->g_buf[0].segid_last_base,&local_60,
                 (long)*(int *)((pic_param->prob).mv_mode + 6),"hal_vp9d_vdpu382",
                 "hal_vp9d_rcb_info_update");
      *(MppBuffer *)((pic_param->prob).partition[1][1] + 2) = local_60;
    }
    else {
      for (rcb_buf._4_4_ = 0; rcb_buf._4_4_ < 3; rcb_buf._4_4_ = rcb_buf._4_4_ + 1) {
        rcb_buf_1 = *(MppBuffer *)(pic_param->ref_frame_coded_height + (ulong)rcb_buf._4_4_ * 0x10);
        if (rcb_buf_1 != (MppBuffer)0x0) {
          mpp_buffer_put_with_caller(rcb_buf_1,"hal_vp9d_rcb_info_update");
          (pic_param->ref_frame_coded_height + (ulong)rcb_buf._4_4_ * 0x10)[0] = 0;
          (pic_param->ref_frame_coded_height + (ulong)rcb_buf._4_4_ * 0x10)[1] = 0;
        }
        mpp_buffer_get_with_tag
                  (hw_ctx->g_buf[0].segid_last_base,&rcb_buf_1,
                   (long)*(int *)((pic_param->prob).mv_mode + 6),"hal_vp9d_vdpu382",
                   "hal_vp9d_rcb_info_update");
        *(MppBuffer *)(pic_param->ref_frame_coded_height + (ulong)rcb_buf._4_4_ * 0x10) = rcb_buf_1;
      }
    }
    *(RK_S32 *)((pic_param->prob).partition[2][0] + 1) = height;
    *(RK_S32 *)((pic_param->prob).partition[2][1] + 2) = width;
    *(RK_U32 *)((pic_param->prob).mv_mode[3] + 1) = local_48;
    *(RK_U32 *)((pic_param->prob).mv_mode[4] + 2) = i;
  }
  return;
}

Assistant:

static void hal_vp9d_rcb_info_update(void *hal,  Vdpu382Vp9dRegSet *hw_regs, void *data)
{
    HalVp9dCtx *p_hal = (HalVp9dCtx*)hal;
    Vdpu382Vp9dCtx *hw_ctx = (Vdpu382Vp9dCtx*)p_hal->hw_ctx;
    DXVA_PicParams_VP9 *pic_param = (DXVA_PicParams_VP9*)data;
    RK_U32 num_tiles = pic_param->log2_tile_rows;
    RK_U32 bit_depth = pic_param->BitDepthMinus8Luma + 8;
    RK_S32 height = vp9_ver_align(pic_param->height);
    RK_S32 width  = vp9_ver_align(pic_param->width);

    if (hw_ctx->num_row_tiles != num_tiles ||
        hw_ctx->bit_depth != bit_depth ||
        hw_ctx->width != width ||
        hw_ctx->height != height) {

        hw_ctx->rcb_buf_size = vdpu382_get_rcb_buf_size(hw_ctx->rcb_info, width, height);
        vp9d_refine_rcb_size(hw_ctx->rcb_info, hw_regs, width, height, pic_param);

        if (p_hal->fast_mode) {
            RK_U32 i;

            for (i = 0; i < MPP_ARRAY_ELEMS(hw_ctx->g_buf); i++) {
                MppBuffer rcb_buf = hw_ctx->g_buf[i].rcb_buf;

                if (rcb_buf) {
                    mpp_buffer_put(rcb_buf);
                    hw_ctx->g_buf[i].rcb_buf = NULL;
                }
                mpp_buffer_get(p_hal->group, &rcb_buf, hw_ctx->rcb_buf_size);
                hw_ctx->g_buf[i].rcb_buf = rcb_buf;
            }
        } else {
            MppBuffer rcb_buf = hw_ctx->rcb_buf;

            if (rcb_buf) {
                mpp_buffer_put(rcb_buf);
                rcb_buf = NULL;
            }
            mpp_buffer_get(p_hal->group, &rcb_buf, hw_ctx->rcb_buf_size);
            hw_ctx->rcb_buf = rcb_buf;
        }

        hw_ctx->num_row_tiles  = num_tiles;
        hw_ctx->bit_depth      = bit_depth;
        hw_ctx->width          = width;
        hw_ctx->height         = height;
    }
}